

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O1

void __thiscall
t_cpp_generator::generate_struct_swap(t_cpp_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  pointer pptVar2;
  t_field *ptVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar5;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  bool bVar6;
  pointer pptVar7;
  string local_60;
  t_cpp_generator *local_40;
  ostream *local_38;
  
  local_40 = this;
  local_38 = out;
  iVar4 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  iVar4 = std::__cxx11::string::compare((char *)CONCAT44(extraout_var,iVar4));
  if (iVar4 == 0) {
LAB_00185a04:
    t_generator::indent_abi_cxx11_(&local_60,(t_generator *)local_40);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_38,local_60._M_dataplus._M_p,local_60._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"void swap(",10);
    iVar4 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,*(char **)CONCAT44(extraout_var_03,iVar4),
                        ((undefined8 *)CONCAT44(extraout_var_03,iVar4))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," &a1, ",6);
    iVar4 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,*(char **)CONCAT44(extraout_var_04,iVar4),
                        ((undefined8 *)CONCAT44(extraout_var_04,iVar4))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," &a2) {",7);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  else {
    iVar4 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    iVar4 = std::__cxx11::string::compare((char *)CONCAT44(extraout_var_00,iVar4));
    if (iVar4 == 0) goto LAB_00185a04;
    t_generator::indent_abi_cxx11_(&local_60,(t_generator *)local_40);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_38,local_60._M_dataplus._M_p,local_60._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"void swap(",10);
    iVar4 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,*(char **)CONCAT44(extraout_var_01,iVar4),
                        ((undefined8 *)CONCAT44(extraout_var_01,iVar4))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," &a, ",5);
    iVar4 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,*(char **)CONCAT44(extraout_var_02,iVar4),
                        ((undefined8 *)CONCAT44(extraout_var_02,iVar4))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," &b) {",6);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  piVar1 = &(local_40->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_60,(t_generator *)local_40);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_38,local_60._M_dataplus._M_p,local_60._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"using ::std::swap;",0x12);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  pptVar7 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pptVar2 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (pptVar7 != pptVar2) {
    bVar6 = false;
    do {
      ptVar3 = *pptVar7;
      if (ptVar3->req_ != T_REQUIRED) {
        bVar6 = true;
      }
      iVar4 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
      iVar4 = std::__cxx11::string::compare((char *)CONCAT44(extraout_var_05,iVar4));
      if (iVar4 == 0) {
LAB_00185c42:
        t_generator::indent_abi_cxx11_(&local_60,(t_generator *)local_40);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_38,local_60._M_dataplus._M_p,local_60._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"swap(a1.",8);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(ptVar3->name_)._M_dataplus._M_p,(ptVar3->name_)._M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", a2.",5);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(ptVar3->name_)._M_dataplus._M_p,(ptVar3->name_)._M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,");",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      }
      else {
        iVar4 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
        iVar4 = std::__cxx11::string::compare((char *)CONCAT44(extraout_var_06,iVar4));
        if (iVar4 == 0) goto LAB_00185c42;
        t_generator::indent_abi_cxx11_(&local_60,(t_generator *)local_40);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_38,local_60._M_dataplus._M_p,local_60._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"swap(a.",7);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(ptVar3->name_)._M_dataplus._M_p,(ptVar3->name_)._M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", b.",4);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(ptVar3->name_)._M_dataplus._M_p,(ptVar3->name_)._M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,");",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
      pptVar7 = pptVar7 + 1;
    } while (pptVar7 != pptVar2);
    if (bVar6) {
      iVar4 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
      iVar4 = std::__cxx11::string::compare((char *)CONCAT44(extraout_var_07,iVar4));
      if (iVar4 == 0) {
LAB_00185d95:
        t_generator::indent_abi_cxx11_(&local_60,(t_generator *)local_40);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_38,local_60._M_dataplus._M_p,local_60._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"swap(a1.__isset, a2.__isset);",0x1d);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      }
      else {
        iVar4 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
        iVar4 = std::__cxx11::string::compare((char *)CONCAT44(extraout_var_08,iVar4));
        if (iVar4 == 0) goto LAB_00185d95;
        t_generator::indent_abi_cxx11_(&local_60,(t_generator *)local_40);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_38,local_60._M_dataplus._M_p,local_60._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"swap(a.__isset, b.__isset);",0x1b);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
    }
  }
  if ((tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_start) goto LAB_00185fce;
  iVar4 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  iVar4 = std::__cxx11::string::compare((char *)CONCAT44(extraout_var_09,iVar4));
  if (iVar4 == 0) {
LAB_00185f06:
    t_generator::indent_abi_cxx11_(&local_60,(t_generator *)local_40);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_38,local_60._M_dataplus._M_p,local_60._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(void) a1;",10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_60,(t_generator *)local_40);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_38,local_60._M_dataplus._M_p,local_60._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(void) a2;",10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  else {
    iVar4 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    iVar4 = std::__cxx11::string::compare((char *)CONCAT44(extraout_var_10,iVar4));
    if (iVar4 == 0) goto LAB_00185f06;
    t_generator::indent_abi_cxx11_(&local_60,(t_generator *)local_40);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_38,local_60._M_dataplus._M_p,local_60._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(void) a;",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_60,(t_generator *)local_40);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_38,local_60._M_dataplus._M_p,local_60._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(void) b;",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
LAB_00185fce:
  poVar5 = local_38;
  t_oop_generator::scope_down(&local_40->super_t_oop_generator,local_38);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  return;
}

Assistant:

void t_cpp_generator::generate_struct_swap(ostream& out, t_struct* tstruct) {
  if (tstruct->get_name() == "a" || tstruct->get_name() == "b") {
    out << indent() << "void swap(" << tstruct->get_name() << " &a1, " << tstruct->get_name()
        << " &a2) {" << endl; 
  } else {
    out << indent() << "void swap(" << tstruct->get_name() << " &a, " << tstruct->get_name()
        << " &b) {" << endl;
  }

  indent_up();

  // Let argument-dependent name lookup find the correct swap() function to
  // use based on the argument types.  If none is found in the arguments'
  // namespaces, fall back to ::std::swap().
  out << indent() << "using ::std::swap;" << endl;

  bool has_nonrequired_fields = false;
  const vector<t_field*>& fields = tstruct->get_members();
  for (auto tfield : fields) {
    if (tfield->get_req() != t_field::T_REQUIRED) {
      has_nonrequired_fields = true;
    }

    if (tstruct->get_name() == "a" || tstruct->get_name() == "b") {
      out << indent() << "swap(a1." << tfield->get_name() << ", a2." << tfield->get_name() << ");"
          << endl;
    } else {
      out << indent() << "swap(a." << tfield->get_name() << ", b." << tfield->get_name() << ");"
          << endl;
    }
  }

  if (has_nonrequired_fields) {
    if (tstruct->get_name() == "a" || tstruct->get_name() == "b") {
      out << indent() << "swap(a1.__isset, a2.__isset);" << endl; 
    } else {
      out << indent() << "swap(a.__isset, b.__isset);" << endl;
    }
  }

  // handle empty structs
  if (fields.size() == 0) {
    if (tstruct->get_name() == "a" || tstruct->get_name() == "b") {
      out << indent() << "(void) a1;" << endl;
      out << indent() << "(void) a2;" << endl;
    } else {
      out << indent() << "(void) a;" << endl;
      out << indent() << "(void) b;" << endl;
    }
  }

  scope_down(out);
  out << endl;
}